

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::nameinfo::nameinfo(nameinfo *this,uint8_t *p)

{
  uint16_t uVar1;
  uint32_t uVar2;
  unsigned_short *__s;
  allocator<unsigned_short> local_59;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  local_58;
  string local_38;
  uchar *local_18;
  uint8_t *p_local;
  nameinfo *this_local;
  
  local_18 = p;
  p_local = (uint8_t *)this;
  std::__cxx11::string::string((string *)&this->_name);
  uVar1 = get16le<unsigned_char_const*>(local_18);
  this->_length = uVar1;
  uVar1 = get16le<unsigned_char_const*>(local_18 + 2);
  this->_flags = uVar1;
  if (this->_length < 5) {
    __s = (unsigned_short *)(local_18 + 4);
    std::allocator<unsigned_short>::allocator(&local_59);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::basic_string(&local_58,__s,4,&local_59);
    ToString<unsigned_short>(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string(&local_58);
    std::allocator<unsigned_short>::~allocator(&local_59);
    this->_hash = 0;
    this->_ptr = 0;
  }
  else {
    uVar2 = get32le<unsigned_char_const*>(local_18 + 4);
    this->_hash = uVar2;
    uVar2 = get32le<unsigned_char_const*>(local_18 + 8);
    this->_ptr = uVar2;
  }
  return;
}

Assistant:

nameinfo(const uint8_t *p)
        {
            _length= get16le(p);
            _flags= get16le(p+2);
            if (_length<=4) {
                _name= ToString(std::Wstring((const WCHAR*)(p+4), 4));
                _hash= 0;
                _ptr= 0;
            }
            else {
                _hash= get32le(p+4);
                _ptr= get32le(p+8);
            }
        }